

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_mv_pred(AV1_COMP *cpi,MACROBLOCK *x,uint8_t *ref_y_buffer,int ref_y_stride,int ref_frame,
                BLOCK_SIZE block_size)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int iVar5;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  byte in_R9B;
  int this_sad;
  uint8_t *ref_y_ptr;
  int fp_col;
  int fp_row;
  MV *this_mv;
  int i;
  int max_mv;
  int best_sad;
  int zero_seen;
  uint8_t *src_y_ptr;
  int num_mv_refs;
  MV pred_mv [3];
  int_mv ref_mv1;
  int_mv ref_mv;
  MV_REFERENCE_FRAME ref_frames [2];
  bool local_85;
  int local_84;
  int local_80;
  int local_7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int_mv *mv;
  int iVar6;
  int iVar7;
  uint uVar8;
  int local_3c;
  int_mv local_38 [4];
  int_mv local_28;
  undefined1 local_23;
  undefined1 local_22;
  byte local_21;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  long *local_8;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_23 = (undefined1)in_R8D;
  local_22 = 0xff;
  local_21 = in_R9B;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = av1_get_ref_mv_from_stack
                       (in_stack_ffffffffffffffa0,
                        (MV_REFERENCE_FRAME *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),iVar7,
                        (MB_MODE_INFO_EXT *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38[3] = av1_get_ref_mv_from_stack
                          (in_stack_ffffffffffffffa0,
                           (MV_REFERENCE_FRAME *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),iVar7,
                           (MB_MODE_INFO_EXT *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_3c = 1;
  local_38[0] = local_28;
  if (local_28.as_int != local_38[3].as_int) {
    local_3c = 2;
    local_38[1] = local_38[3];
  }
  uVar1 = *(undefined8 *)(local_10 + 0x30);
  uVar8 = 0;
  iVar7 = 0x7fffffff;
  local_80 = 0;
  for (iVar6 = 0; iVar6 < local_3c; iVar6 = iVar6 + 1) {
    mv = local_38 + iVar6;
    enc_clamp_mv((AV1_COMMON *)CONCAT44(uVar8,iVar7),(MACROBLOCKD *)CONCAT44(local_80,iVar6),
                 &mv->as_mv);
    iVar2 = (int)((mv->as_mv).row + 3 + (uint)(-1 < (mv->as_mv).row)) >> 3;
    iVar3 = (int)((mv->as_mv).col + 3 + (uint)(-1 < (mv->as_mv).col)) >> 3;
    iVar4 = (int)(mv->as_mv).row;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    iVar5 = (int)(mv->as_mv).col;
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    if (iVar5 < iVar4) {
      local_7c = (int)(mv->as_mv).row;
      if (local_7c < 1) {
        local_7c = -local_7c;
      }
    }
    else {
      local_7c = (int)(mv->as_mv).col;
      if (local_7c < 1) {
        local_7c = -local_7c;
      }
    }
    if (local_80 <= local_7c >> 3) {
      iVar4 = (int)(mv->as_mv).row;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      iVar5 = (int)(mv->as_mv).col;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      if (iVar5 < iVar4) {
        local_84 = (int)(mv->as_mv).row;
        if (local_84 < 1) {
          local_84 = -local_84;
        }
      }
      else {
        local_84 = (int)(mv->as_mv).col;
        if (local_84 < 1) {
          local_84 = -local_84;
        }
      }
      local_80 = local_84 >> 3;
    }
    if (((iVar2 != 0) || (iVar3 != 0)) || (uVar8 == 0)) {
      local_85 = iVar2 == 0 && iVar3 == 0;
      uVar8 = local_85 | uVar8;
      iVar4 = (**(code **)(*local_8 + 0xc900 + (ulong)local_21 * 0x70))
                        (uVar1,*(undefined4 *)(local_10 + 0x48),
                         local_18 + (local_1c * iVar2 + iVar3),local_1c);
      if (iVar4 < iVar7) {
        iVar7 = iVar4;
      }
      if (iVar6 == 0) {
        *(int *)(local_10 + 0x15d98 + (long)local_20 * 4) = iVar4;
      }
      else if (iVar6 == 1) {
        *(int *)(local_10 + 0x15db8 + (long)local_20 * 4) = iVar4;
      }
    }
  }
  *(int *)(local_10 + 0x1f6c4 + (long)local_20 * 4) = local_80;
  *(int *)(local_10 + 0x15d70 + (long)local_20 * 4) = iVar7;
  return;
}

Assistant:

void av1_mv_pred(const AV1_COMP *cpi, MACROBLOCK *x, uint8_t *ref_y_buffer,
                 int ref_y_stride, int ref_frame, BLOCK_SIZE block_size) {
  const MV_REFERENCE_FRAME ref_frames[2] = { ref_frame, NONE_FRAME };
  const int_mv ref_mv =
      av1_get_ref_mv_from_stack(0, ref_frames, 0, &x->mbmi_ext);
  const int_mv ref_mv1 =
      av1_get_ref_mv_from_stack(0, ref_frames, 1, &x->mbmi_ext);
  MV pred_mv[MAX_MV_REF_CANDIDATES + 1];
  int num_mv_refs = 0;
  pred_mv[num_mv_refs++] = ref_mv.as_mv;
  if (ref_mv.as_int != ref_mv1.as_int) {
    pred_mv[num_mv_refs++] = ref_mv1.as_mv;
  }

  assert(num_mv_refs <= (int)(sizeof(pred_mv) / sizeof(pred_mv[0])));

  const uint8_t *const src_y_ptr = x->plane[0].src.buf;
  int zero_seen = 0;
  int best_sad = INT_MAX;
  int max_mv = 0;
  // Get the sad for each candidate reference mv.
  for (int i = 0; i < num_mv_refs; ++i) {
    MV *this_mv = &pred_mv[i];
    enc_clamp_mv(&cpi->common, &x->e_mbd, this_mv);

    const int fp_row = (this_mv->row + 3 + (this_mv->row >= 0)) >> 3;
    const int fp_col = (this_mv->col + 3 + (this_mv->col >= 0)) >> 3;
    max_mv = AOMMAX(max_mv, AOMMAX(abs(this_mv->row), abs(this_mv->col)) >> 3);

    if (fp_row == 0 && fp_col == 0 && zero_seen) continue;
    zero_seen |= (fp_row == 0 && fp_col == 0);

    const uint8_t *const ref_y_ptr =
        &ref_y_buffer[ref_y_stride * fp_row + fp_col];
    // Find sad for current vector.
    const int this_sad = cpi->ppi->fn_ptr[block_size].sdf(
        src_y_ptr, x->plane[0].src.stride, ref_y_ptr, ref_y_stride);
    // Note if it is the best so far.
    if (this_sad < best_sad) {
      best_sad = this_sad;
    }
    if (i == 0)
      x->pred_mv0_sad[ref_frame] = this_sad;
    else if (i == 1)
      x->pred_mv1_sad[ref_frame] = this_sad;
  }

  // Note the index of the mv that worked best in the reference list.
  x->max_mv_context[ref_frame] = max_mv;
  x->pred_mv_sad[ref_frame] = best_sad;
}